

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O0

void __thiscall
Outputs::Speaker::
LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_GI::AY38910::AY38910<false>_>_>,_false>
::resample_input_buffer
          (LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_GI::AY38910::AY38910<false>_>_>,_false>
           *this,int scale)

{
  int iVar1;
  bool bVar2;
  short sVar3;
  pointer this_00;
  short *psVar4;
  reference pvVar5;
  int *piVar6;
  size_type sVar7;
  size_type sVar8;
  ulong uVar9;
  float fVar10;
  short *input_buffer;
  size_t steps;
  int local_18;
  int local_14;
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_GI::AY38910::AY38910<false>_>_>,_false>
  *pLStack_10;
  int scale_local;
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_GI::AY38910::AY38910<false>_>_>,_false>
  *this_local;
  
  local_14 = scale;
  pLStack_10 = this;
  bVar2 = std::vector<short,_std::allocator<short>_>::empty(&this->output_buffer_);
  if (!bVar2) {
    this_00 = std::
              unique_ptr<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>
              ::operator->(&this->filter_);
    psVar4 = std::vector<short,_std::allocator<short>_>::data(&this->input_buffer_);
    sVar3 = SignalProcessing::FIRFilter::apply(this_00,psVar4,1);
    pvVar5 = std::vector<short,_std::allocator<short>_>::operator[]
                       (&this->output_buffer_,this->output_buffer_pointer_);
    *pvVar5 = sVar3;
    this->output_buffer_pointer_ = this->output_buffer_pointer_ + 1;
    if (local_14 != 0x10000) {
      pvVar5 = std::vector<short,_std::allocator<short>_>::operator[]
                         (&this->output_buffer_,this->output_buffer_pointer_ - 1);
      local_18 = *pvVar5 * local_14 >> 0x10;
      steps._4_4_ = 0xffff8000;
      steps._0_4_ = 0x7fff;
      piVar6 = std::clamp<int>(&local_18,(int *)((long)&steps + 4),(int *)&steps);
      iVar1 = *piVar6;
      pvVar5 = std::vector<short,_std::allocator<short>_>::operator[]
                         (&this->output_buffer_,this->output_buffer_pointer_ - 1);
      *pvVar5 = (value_type)iVar1;
    }
    sVar8 = this->output_buffer_pointer_;
    sVar7 = std::vector<short,_std::allocator<short>_>::size(&this->output_buffer_);
    if (sVar8 == sVar7) {
      this->output_buffer_pointer_ = 0;
      Speaker::did_complete_samples
                (&this->super_Speaker,&this->super_Speaker,&this->output_buffer_,false);
    }
    fVar10 = this->step_rate_ + this->position_error_;
    uVar9 = (ulong)fVar10;
    uVar9 = uVar9 | (long)(fVar10 - 9.223372e+18) & (long)uVar9 >> 0x3f;
    fVar10 = fmodf(this->step_rate_ + this->position_error_,1.0);
    this->position_error_ = fVar10;
    sVar8 = std::vector<short,_std::allocator<short>_>::size(&this->input_buffer_);
    if (uVar9 < sVar8) {
      psVar4 = std::vector<short,_std::allocator<short>_>::data(&this->input_buffer_);
      sVar8 = std::vector<short,_std::allocator<short>_>::size(&this->input_buffer_);
      memmove(psVar4,psVar4 + uVar9,(sVar8 - uVar9) * 2);
      this->input_buffer_depth_ = this->input_buffer_depth_ - uVar9;
    }
    else {
      sVar8 = std::vector<short,_std::allocator<short>_>::size(&this->input_buffer_);
      if (sVar8 < uVar9) {
        sVar8 = std::vector<short,_std::allocator<short>_>::size(&this->input_buffer_);
        PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_GI::AY38910::AY38910<false>_>_>::
        skip_samples((PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_GI::AY38910::AY38910<false>_>_>
                      *)this,uVar9 - sVar8);
      }
      this->input_buffer_depth_ = 0;
    }
  }
  return;
}

Assistant:

inline void resample_input_buffer(int scale) {
			if(output_buffer_.empty()) {
				return;
			}

			if constexpr (is_stereo) {
				output_buffer_[output_buffer_pointer_ + 0] = filter_->apply(input_buffer_.data(), 2);
				output_buffer_[output_buffer_pointer_ + 1] = filter_->apply(input_buffer_.data() + 1, 2);
				output_buffer_pointer_+= 2;
			} else {
				output_buffer_[output_buffer_pointer_] = filter_->apply(input_buffer_.data());
				output_buffer_pointer_++;
			}

			// Apply scale, if supplied, clamping appropriately.
			if(scale != 65536) {
				#define SCALE(x) x = int16_t(std::clamp((int(x) * scale) >> 16, -32768, 32767))
				if constexpr (is_stereo) {
					SCALE(output_buffer_[output_buffer_pointer_ - 2]);
					SCALE(output_buffer_[output_buffer_pointer_ - 1]);
				} else {
					SCALE(output_buffer_[output_buffer_pointer_ - 1]);
				}
				#undef SCALE
			}

			// Announce to delegate if full.
			if(output_buffer_pointer_ == output_buffer_.size()) {
				output_buffer_pointer_ = 0;
				did_complete_samples(this, output_buffer_, is_stereo);
			}

			// If the next loop around is going to reuse some of the samples just collected, use a memmove to
			// preserve them in the correct locations (TODO: use a longer buffer to fix that?) and don't skip
			// anything. Otherwise skip as required to get to the next sample batch and don't expect to reuse.
			const size_t steps = size_t(step_rate_ + position_error_) * (is_stereo + 1);
			position_error_ = fmodf(step_rate_ + position_error_, 1.0f);
			if(steps < input_buffer_.size()) {
				auto *const input_buffer = input_buffer_.data();
				std::memmove(	input_buffer,
								&input_buffer[steps],
								sizeof(int16_t) * (input_buffer_.size() - steps));
				input_buffer_depth_ -= steps;
			} else {
				if(steps > input_buffer_.size()) {
					static_cast<ConcreteT *>(this)->skip_samples((steps - input_buffer_.size()) / (1 + is_stereo));
				}
				input_buffer_depth_ = 0;
			}
		}